

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_helpers.hpp
# Opt level: O2

char * duckdb::NumericHelper::FormatUnsigned<unsigned_long>(unsigned_long value,char *ptr)

{
  char cVar1;
  uint uVar2;
  long lStack_30;
  
  for (; 99 < value; value = value / 100) {
    uVar2 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert((value % 100) * 2);
    ptr[-1] = duckdb_fmt::v6::internal::basic_data<void>::digits[uVar2 + 1];
    ptr[-2] = duckdb_fmt::v6::internal::basic_data<void>::digits[uVar2];
    ptr = ptr + -2;
  }
  if (value < 10) {
    cVar1 = NumericCastImpl<char,_unsigned_long,_false>::Convert(value | 0x30);
    lStack_30 = -1;
  }
  else {
    uVar2 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(value * 2);
    ptr[-1] = duckdb_fmt::v6::internal::basic_data<void>::digits[uVar2 + 1];
    cVar1 = duckdb_fmt::v6::internal::basic_data<void>::digits[uVar2];
    lStack_30 = -2;
  }
  ptr[lStack_30] = cVar1;
  return ptr + lStack_30;
}

Assistant:

static char *FormatUnsigned(T value, char *ptr) {
		while (value >= 100) {
			// Integer division is slow so do it for a group of two digits instead
			// of for every digit. The idea comes from the talk by Alexandrescu
			// "Three Optimization Tips for C++".
			auto index = NumericCast<unsigned>((value % 100) * 2);
			value /= 100;
			*--ptr = duckdb_fmt::internal::data::digits[index + 1];
			*--ptr = duckdb_fmt::internal::data::digits[index];
		}
		if (value < 10) {
			*--ptr = NumericCast<char>('0' + value);
			return ptr;
		}
		auto index = NumericCast<unsigned>(value * 2);
		*--ptr = duckdb_fmt::internal::data::digits[index + 1];
		*--ptr = duckdb_fmt::internal::data::digits[index];
		return ptr;
	}